

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

bool __thiscall QPDFObjectHandle::getFilterOnWrite(QPDFObjectHandle *this)

{
  bool bVar1;
  QPDFObjectHandle local_20;
  QPDFObjectHandle *local_10;
  QPDFObjectHandle *this_local;
  
  local_10 = this;
  as_stream(&local_20,(typed)this);
  bVar1 = ::qpdf::Stream::getFilterOnWrite((Stream *)&local_20);
  ::qpdf::Stream::~Stream((Stream *)&local_20);
  return bVar1;
}

Assistant:

bool
QPDFObjectHandle::getFilterOnWrite()
{
    return as_stream(error).getFilterOnWrite();
}